

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O0

uint8_t __thiscall ami_nvar_t::nvar_entry_body_t::extended_header_checksum(nvar_entry_body_t *this)

{
  kstream *pkVar1;
  bool bVar2;
  uint8_t uVar3;
  uint16_t uVar4;
  nvar_entry_t *pnVar5;
  nvar_attributes_t *pnVar6;
  nvar_extended_attributes_t *this_00;
  uint64_t uVar7;
  kstream *this_01;
  undefined1 local_28 [8];
  streampos _pos;
  nvar_entry_body_t *this_local;
  
  if ((this->f_extended_header_checksum & 1U) == 0) {
    this->n_extended_header_checksum = true;
    _pos._M_state = (__mbstate_t)this;
    pnVar5 = _parent(this);
    pnVar6 = nvar_entry_t::attributes(pnVar5);
    bVar2 = nvar_attributes_t::valid(pnVar6);
    if (bVar2) {
      pnVar5 = _parent(this);
      pnVar6 = nvar_entry_t::attributes(pnVar5);
      bVar2 = nvar_attributes_t::extended_header(pnVar6);
      if ((bVar2) && (uVar4 = extended_header_size(this), 3 < uVar4)) {
        this_00 = extended_header_attributes(this);
        bVar2 = nvar_extended_attributes_t::checksum(this_00);
        if (bVar2) {
          this->n_extended_header_checksum = false;
          uVar7 = kaitai::kstream::pos((this->super_kstruct).m__io);
          std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)local_28,uVar7);
          pkVar1 = (this->super_kstruct).m__io;
          this_01 = kaitai::kstruct::_io(&this->super_kstruct);
          uVar7 = kaitai::kstream::pos(this_01);
          kaitai::kstream::seek(pkVar1,uVar7 - 3);
          uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
          this->m_extended_header_checksum = uVar3;
          pkVar1 = (this->super_kstruct).m__io;
          uVar7 = std::fpos::operator_cast_to_long((fpos *)local_28);
          kaitai::kstream::seek(pkVar1,uVar7);
          this->f_extended_header_checksum = true;
        }
      }
    }
    this_local._7_1_ = this->m_extended_header_checksum;
  }
  else {
    this_local._7_1_ = this->m_extended_header_checksum;
  }
  return this_local._7_1_;
}

Assistant:

uint8_t ami_nvar_t::nvar_entry_body_t::extended_header_checksum() {
    if (f_extended_header_checksum)
        return m_extended_header_checksum;
    n_extended_header_checksum = true;
    if ( ((_parent()->attributes()->valid()) && (_parent()->attributes()->extended_header()) && (extended_header_size() >= ((1 + 1) + 2)) && (extended_header_attributes()->checksum())) ) {
        n_extended_header_checksum = false;
        std::streampos _pos = m__io->pos();
        m__io->seek(((_io()->pos() - 2) - 1));
        m_extended_header_checksum = m__io->read_u1();
        m__io->seek(_pos);
        f_extended_header_checksum = true;
    }
    return m_extended_header_checksum;
}